

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::Backwards::BackwardsRegion::h_s(BackwardsRegion *this,double s)

{
  double dVar1;
  double dVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong local_38;
  size_t i;
  double summer;
  double sigma2;
  double sigma1;
  double s_local;
  BackwardsRegion *this_local;
  
  dVar1 = this->s_star;
  dVar2 = this->s2_star;
  i = 0;
  for (local_38 = 0; local_38 < this->N; local_38 = local_38 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->n,local_38);
    dVar6 = *pvVar3;
    dVar4 = pow(s / dVar1,this->d);
    dVar5 = this->a;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->I,local_38);
    dVar4 = pow(dVar4 + dVar5,*pvVar3);
    dVar5 = this->b;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->J,local_38);
    dVar5 = pow(s / dVar2 + dVar5,*pvVar3);
    i = (size_t)(dVar6 * dVar4 * dVar5 + (double)i);
  }
  dVar1 = this->e;
  dVar6 = pow((double)i,this->c);
  dVar2 = this->e;
  dVar5 = exp((double)i);
  return ((1.0 - dVar1) * dVar6 + dVar2 * dVar5) * this->h_star;
}

Assistant:

virtual double h_s(double s) const{
                const double sigma1 = s/s_star, sigma2 = s/s2_star;
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*std::pow(std::pow(sigma1,d)+a, I[i])*std::pow(sigma2+b, J[i]);
                }
                // NOTE: c=1, e=0 : Straight summation
                //       c>1, e=0 : Power fit
                //       c=1, e=1 : Exp fit
                return ( (1-e)*std::pow(summer,c) + e*exp(summer) )*h_star;
            }